

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

Spline * createLandSpline(SplineStack *ss,float f,float g,float h,float i,float j,float k,int bl)

{
  int iVar1;
  Spline *val;
  Spline *val_00;
  Spline *val_01;
  SplineStack *ss_00;
  Spline *val_02;
  Spline *val_03;
  Spline *val_04;
  Spline *rsp;
  Spline *pSVar2;
  Spline *rsp_00;
  int in_ESI;
  SplineStack *in_RDI;
  float in_XMM0_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  SplineStack *unaff_retaddr;
  Spline *sp;
  Spline *sp9;
  Spline *sp8;
  Spline *sp7;
  Spline *sp6;
  Spline *sp5;
  Spline *sp4;
  float ih;
  Spline *sp3;
  Spline *sp2;
  Spline *sp1;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  SplineStack *in_stack_ffffffffffffffb0;
  
  lerp((double)in_XMM3_Da,0.6000000238418579,1.5);
  val = createSpline_38219(unaff_retaddr,(float)((ulong)in_RDI >> 0x20),(int)in_RDI);
  lerp((double)in_XMM3_Da,0.6000000238418579,1.0);
  val_00 = createSpline_38219(unaff_retaddr,(float)((ulong)in_RDI >> 0x20),(int)in_RDI);
  val_01 = createSpline_38219(unaff_retaddr,(float)((ulong)in_RDI >> 0x20),(int)in_RDI);
  ss_00 = (SplineStack *)
          createFlatOffsetSpline
                    (in_stack_ffffffffffffffb0,(float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     (float)in_stack_ffffffffffffffa8,
                     (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (float)in_stack_ffffffffffffffa0,
                     (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (float)in_stack_ffffffffffffff98);
  val_02 = createFlatOffsetSpline
                     (ss_00,(float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                      (float)in_stack_ffffffffffffffa8,
                      (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (float)in_stack_ffffffffffffffa0,
                      (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (float)in_stack_ffffffffffffff98);
  val_03 = createFlatOffsetSpline
                     (ss_00,(float)((ulong)val_02 >> 0x20),SUB84(val_02,0),
                      (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (float)in_stack_ffffffffffffffa0,
                      (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (float)in_stack_ffffffffffffff98);
  val_04 = createFlatOffsetSpline
                     (ss_00,(float)((ulong)val_02 >> 0x20),SUB84(val_02,0),
                      (float)((ulong)val_03 >> 0x20),SUB84(val_03,0),
                      (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (float)in_stack_ffffffffffffff98);
  iVar1 = in_RDI->len;
  in_RDI->len = iVar1 + 1;
  rsp = in_RDI->stack + iVar1;
  rsp->typ = 2;
  pSVar2 = createFixSpline(in_RDI,in_XMM0_Da);
  addSplineVal(rsp,-1.0,pSVar2,0.0);
  addSplineVal(rsp,-0.4,val_03,0.0);
  pSVar2 = createFixSpline(in_RDI,in_XMM2_Da + 0.07);
  addSplineVal(rsp,0.0,pSVar2,0.0);
  pSVar2 = createFlatOffsetSpline
                     (ss_00,(float)((ulong)val_02 >> 0x20),SUB84(val_02,0),
                      (float)((ulong)val_03 >> 0x20),SUB84(val_03,0),(float)((ulong)val_04 >> 0x20),
                      SUB84(val_04,0));
  iVar1 = in_RDI->len;
  in_RDI->len = iVar1 + 1;
  rsp_00 = in_RDI->stack + iVar1;
  rsp_00->typ = 1;
  addSplineVal(rsp_00,-0.85,val,0.0);
  addSplineVal(rsp_00,-0.7,val_00,0.0);
  addSplineVal(rsp_00,-0.4,val_01,0.0);
  addSplineVal(rsp_00,-0.35,ss_00->stack,0.0);
  addSplineVal(rsp_00,-0.1,val_02,0.0);
  addSplineVal(rsp_00,0.2,val_03,0.0);
  if (in_ESI != 0) {
    addSplineVal(rsp_00,0.4,val_04,0.0);
    addSplineVal(rsp_00,0.45,rsp,0.0);
    addSplineVal(rsp_00,0.55,rsp,0.0);
    addSplineVal(rsp_00,0.58,val_04,0.0);
  }
  addSplineVal(rsp_00,0.7,pSVar2,0.0);
  return rsp_00;
}

Assistant:

static Spline *createLandSpline(
    SplineStack *ss, float f, float g, float h, float i, float j, float k, int bl)
{
    Spline *sp1 = createSpline_38219(ss, lerp(i, 0.6F, 1.5F), bl);
    Spline *sp2 = createSpline_38219(ss, lerp(i, 0.6F, 1.0F), bl);
    Spline *sp3 = createSpline_38219(ss, i, bl);
    const float ih = 0.5F * i;
    Spline *sp4 = createFlatOffsetSpline(ss, f-0.15F, ih, ih, ih, i*0.6F, 0.5F);
    Spline *sp5 = createFlatOffsetSpline(ss, f, j*i, g*i, ih, i*0.6F, 0.5F);
    Spline *sp6 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);
    Spline *sp7 = createFlatOffsetSpline(ss, f, j, j, g, h, 0.5F);

    Spline *sp8 = &ss->stack[ss->len++];
    sp8->typ = SP_RIDGES;
    addSplineVal(sp8, -1.0F, createFixSpline(ss, f), 0.0F);
    addSplineVal(sp8, -0.4F, sp6, 0.0F);
    addSplineVal(sp8,  0.0F, createFixSpline(ss, h + 0.07F), 0.0F);

    Spline *sp9 = createFlatOffsetSpline(ss, -0.02F, k, k, g, h, 0.0F);
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_EROSION;
    addSplineVal(sp, -0.85F, sp1, 0.0F);
    addSplineVal(sp, -0.7F,  sp2, 0.0F);
    addSplineVal(sp, -0.4F,  sp3, 0.0F);
    addSplineVal(sp, -0.35F, sp4, 0.0F);
    addSplineVal(sp, -0.1F,  sp5, 0.0F);
    addSplineVal(sp,  0.2F,  sp6, 0.0F);
    if (bl) {
        addSplineVal(sp, 0.4F,  sp7, 0.0F);
        addSplineVal(sp, 0.45F, sp8, 0.0F);
        addSplineVal(sp, 0.55F, sp8, 0.0F);
        addSplineVal(sp, 0.58F, sp7, 0.0F);
    }
    addSplineVal(sp, 0.7F, sp9, 0.0F);
    return sp;
}